

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

DVector2 __thiscall AActor::Vec2To(AActor *this,AActor *other)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long in_RDX;
  double dVar6;
  double dVar7;
  DVector2 DVar8;
  
  dVar3 = *(double *)(in_RDX + 0x50);
  iVar1 = *(int *)(*(long *)(in_RDX + 0x110) + 0x1f8);
  iVar2 = other->Sector->PortalGroup;
  dVar6 = 0.0;
  dVar7 = 0.0;
  if (iVar1 != iVar2) {
    dVar6 = Displacements.data.Array[iVar2 * Displacements.size + iVar1].pos.X;
    dVar7 = Displacements.data.Array[iVar2 * Displacements.size + iVar1].pos.Y;
  }
  dVar4 = (other->__Pos).X;
  dVar5 = (other->__Pos).Y;
  DVar8.X = (_func_int **)((*(double *)(in_RDX + 0x48) + dVar6) - dVar4);
  (this->super_DThinker).super_DObject._vptr_DObject = DVar8.X;
  (this->super_DThinker).super_DObject.Class = (PClass *)((dVar3 + dVar7) - dVar5);
  DVar8.Y = dVar4;
  return DVar8;
}

Assistant:

DVector2 Vec2To(AActor *other) const
	{
		return other->PosRelative(this) - Pos();
	}